

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void rmult(double *A,double *B,double *C,int m,int n,int p)

{
  if (0 < p * m) {
    memset(C,0,(ulong)(uint)(p * m) << 3);
  }
  recmult(A,B,C,m,n,p,m,n,p);
  return;
}

Assistant:

void rmult(double* A, double* B, double* C,int m,int n, int p) {
	int strA,strB,strC;
	int N;
	register int i;
	strA = m;
	strB = n;
	strC = p;
	N = m * p;
	for(i = 0; i < N; ++i) {
		C[i] = 0.;
	}
	
	recmult(A,B,C,m,n,p,strA,strB,strC);
	
}